

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.h
# Opt level: O3

bool __thiscall Thread::isAutoDelete(Thread *this)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->mMutex);
  if (iVar2 == 0) {
    bVar1 = this->mAutoDelete;
    pthread_mutex_unlock((pthread_mutex_t *)&this->mMutex);
    return bVar1;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

bool isAutoDelete() const
    {
        std::lock_guard<std::mutex> lock(mMutex);
        return mAutoDelete;
    }